

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

bool Utils::compareClsidType(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,string *clsid)

{
  int iVar1;
  uint uVar2;
  undefined1 uVar3;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  pointer puVar4;
  ostream *poVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ulong uVar7;
  pointer puVar8;
  int to;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_00;
  pointer unaff_RBX;
  char *pcVar9;
  char *__x;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vStack_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vStack_78;
  string sStack_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vStack_40;
  pointer pcStack_28;
  
  uVar14 = 0;
  bVar15 = false;
  iVar10 = 0;
  while( true ) {
    bVar16 = (clsid->_M_string_length & 0xfffffffffffffffe) != 0xe;
    uVar2 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar14];
    unaff_RBX = (pointer)CONCAT71((int7)((ulong)unaff_RBX >> 8),uVar2 != 0 || bVar16);
    if (uVar2 != 0 || bVar16) break;
LAB_00112cae:
    bVar15 = 0xe < uVar14;
    uVar14 = uVar14 + 1;
    if (uVar14 == 0x10) {
      return bVar15;
    }
  }
  uVar7 = (ulong)iVar10;
  if (uVar7 < clsid->_M_string_length) {
    unaff_RBX = (clsid->_M_dataplus)._M_p;
    if ((char)uVar2 != unaff_RBX[uVar7]) {
      return bVar15;
    }
    iVar10 = iVar10 + 1;
    goto LAB_00112cae;
  }
  __x = "basic_string::at: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar7);
  puVar4 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pcStack_28 = unaff_RBX;
  if ((((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish == puVar4) {
LAB_00112d84:
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  }
  else {
    uVar2 = *puVar4;
    switch(uVar2) {
    case 0x30:
    case 0x33:
    case 0x34:
switchD_00112d0b_caseD_30:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"UNKNOWN type for ItemID",0x17);
      goto LAB_00112d84;
    case 0x31:
      pcVar9 = "TYPE_DIRECTORY: ";
      lVar11 = 0x10;
      break;
    case 0x32:
      pcVar9 = "TYPE_FILE: ";
      lVar11 = 0xb;
      break;
    case 0x35:
      pcVar9 = "TYPE_DIRECTORY_OLD: ";
      lVar11 = 0x14;
      break;
    case 0x36:
      pcVar9 = "TYPE_FILE_OLD: ";
      lVar11 = 0xf;
      break;
    default:
      if (uVar2 == 0x1f) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TYPE_CLSID: ",0xc)
        ;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&vStack_40,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x);
        printSid(&vStack_40,2);
        if (vStack_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)vStack_40.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_40.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint *)0x0;
        vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
        puVar4 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar8 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (8 < (ulong)((long)puVar8 - (long)puVar4)) {
          uVar14 = 2;
          lVar11 = 8;
          do {
            if (vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&vStack_90,
                         (iterator)
                         vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)((long)puVar4 + lVar11));
              puVar4 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              puVar8 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
            }
            else {
              *vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = *(uint *)((long)puVar4 + lVar11);
              vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            uVar14 = uVar14 + 1;
            lVar11 = lVar11 + 4;
          } while (uVar14 < (ulong)((long)puVar8 - (long)puVar4 >> 2));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," : ",3);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&vStack_78,&vStack_90);
        getClsidType_abi_cxx11_(&sStack_60,(Utils *)&vStack_78,vec_00);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,sStack_60._M_dataplus._M_p,
                            sStack_60._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        paVar6 = &sStack_60.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_60._M_dataplus._M_p != paVar6) {
          operator_delete(sStack_60._M_dataplus._M_p,sStack_60.field_2._M_allocated_capacity + 1);
          paVar6 = extraout_RAX;
        }
        uVar3 = SUB81(paVar6,0);
        if (vStack_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)vStack_78.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_78.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          uVar3 = extraout_AL;
        }
        if (vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)vStack_90.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_90.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          uVar3 = extraout_AL_00;
        }
        return (bool)uVar3;
      }
      if (uVar2 != 0x23) goto switchD_00112d0b_caseD_30;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"TYPE_DRIVE_OLD: ",0x10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    case 0x2f:
      print_vec_unicode((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x);
      goto LAB_00112d84;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,defaultOffset_abi_cxx11_._M_dataplus._M_p,
                        defaultOffset_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Short Name: ",0xe);
    puVar4 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = (long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
    iVar10 = (int)uVar14;
    if (0xc < uVar14) {
      uVar7 = 0xc;
      do {
        if (puVar4[uVar7] == 0) goto LAB_00112e84;
        uVar7 = uVar7 + 1;
      } while (uVar14 != uVar7);
    }
    uVar7 = (ulong)(iVar10 - 1);
LAB_00112e84:
    to = (int)uVar7;
    iVar13 = to;
    if (0 < (iVar10 + -0xf) - to) {
      iVar12 = -to;
      puVar4 = puVar4 + (long)to + 0xe;
      do {
        if (((((puVar4[-0xe] == 0) && (puVar4[-0xd] == 0)) && (puVar4[-0xc] == 0)) &&
            (((puVar4[-0xb] == 0 && (puVar4[-10] == 0)) &&
             ((puVar4[-9] == 0 && ((puVar4[-8] == 0 && (puVar4[-7] == 0)))))))) &&
           ((puVar4[-6] == 0 &&
            (((((puVar4[-5] == 0 && (puVar4[-4] == 0)) && (puVar4[-3] == 0)) &&
              ((puVar4[-2] == 0 && (puVar4[-1] == 0)))) && (*puVar4 == 0)))))) {
          iVar13 = -iVar12;
          break;
        }
        puVar4 = puVar4 + 1;
        iVar1 = iVar10 + iVar12;
        iVar12 = iVar12 + -1;
        iVar13 = iVar10 + -0xf;
      } while (1 < iVar1 + -0xf);
    }
    print_vec_unicode_from_to((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x,0xc,to);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,defaultOffset_abi_cxx11_._M_dataplus._M_p,
                        defaultOffset_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Long Name:  ",0xe);
    print_vec_unicode_from_to
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x,iVar13 + 0x13,
               (int)((ulong)((long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x)->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) + -3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  }
  std::ostream::put('(');
  uVar3 = std::ostream::flush();
  return (bool)uVar3;
}

Assistant:

bool Utils::compareClsidType(std::vector<unsigned int> vec, std::string clsid) {
    int j = 0;      // Used for cases when clsid contains \x00 -> I remove all \x00 from clsid-s and it's len = 15 or 14

    for(int i = 0 ; i < 16; ++i) {
        if((vec[i] == 0x00) && (clsid.size() == 15 || clsid.size() == 14))
            continue;

        if((char)vec[i] != (char)clsid.at(j))
            return false;

        ++j;
    }
    return true;
}